

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iconify.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  GLFWmonitor **ppGVar2;
  GLFWwindow *pGVar3;
  char *pcVar4;
  char *pcVar5;
  GLFWmonitor *local_48;
  GLFWmonitor *monitor;
  GLFWmonitor **monitors;
  undefined8 *puStack_30;
  int monitor_count;
  GLFWwindow **windows;
  GLboolean all_monitors;
  GLboolean fullscreen;
  int iStack_20;
  GLboolean auto_iconify;
  int window_count;
  int i;
  int ch;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  windows._3_1_ = 1;
  windows._2_1_ = '\0';
  windows._1_1_ = '\0';
  _i = argv;
  argv_local._0_4_ = argc;
  while (window_count = getopt((int)argv_local,_i,"afhn"), window_count != -1) {
    switch(window_count) {
    case 0x61:
      windows._1_1_ = '\x01';
      break;
    default:
      usage();
      exit(1);
    case 0x66:
      windows._2_1_ = '\x01';
      break;
    case 0x68:
      usage();
      exit(0);
    case 0x6e:
      windows._3_1_ = 0;
    }
  }
  glfwSetErrorCallback(error_callback);
  iVar1 = glfwInit();
  if (iVar1 == 0) {
    exit(1);
  }
  glfwWindowHint(0x20006,(uint)windows._3_1_);
  if ((windows._2_1_ == '\0') || (windows._1_1_ == '\0')) {
    local_48 = (GLFWmonitor *)0x0;
    if (windows._2_1_ != '\0') {
      local_48 = glfwGetPrimaryMonitor();
    }
    windows._4_4_ = 1;
    puStack_30 = (undefined8 *)calloc(1,8);
    pGVar3 = create_window(local_48);
    *puStack_30 = pGVar3;
  }
  else {
    ppGVar2 = glfwGetMonitors((int *)((long)&monitors + 4));
    windows._4_4_ = monitors._4_4_;
    puStack_30 = (undefined8 *)calloc((long)monitors._4_4_,8);
    for (iStack_20 = 0; iStack_20 < monitors._4_4_; iStack_20 = iStack_20 + 1) {
      pGVar3 = create_window(ppGVar2[iStack_20]);
      puStack_30[iStack_20] = pGVar3;
      if (puStack_30[iStack_20] == 0) break;
    }
  }
  for (iStack_20 = 0; iStack_20 < windows._4_4_; iStack_20 = iStack_20 + 1) {
    glfwSetKeyCallback((GLFWwindow *)puStack_30[iStack_20],key_callback);
    glfwSetFramebufferSizeCallback((GLFWwindow *)puStack_30[iStack_20],framebuffer_size_callback);
    glfwSetWindowSizeCallback((GLFWwindow *)puStack_30[iStack_20],window_size_callback);
    glfwSetWindowFocusCallback((GLFWwindow *)puStack_30[iStack_20],window_focus_callback);
    glfwSetWindowIconifyCallback((GLFWwindow *)puStack_30[iStack_20],window_iconify_callback);
    glfwSetWindowRefreshCallback((GLFWwindow *)puStack_30[iStack_20],window_refresh_callback);
    window_refresh_callback((GLFWwindow *)puStack_30[iStack_20]);
    iVar1 = glfwGetWindowAttrib((GLFWwindow *)puStack_30[iStack_20],0x20002);
    pcVar4 = "restored";
    if (iVar1 != 0) {
      pcVar4 = "iconified";
    }
    iVar1 = glfwGetWindowAttrib((GLFWwindow *)puStack_30[iStack_20],0x20001);
    pcVar5 = "defocused";
    if (iVar1 != 0) {
      pcVar5 = "focused";
    }
    printf("Window is %s and %s\n",pcVar4,pcVar5);
  }
  while( true ) {
    glfwPollEvents();
    iStack_20 = 0;
    while ((iStack_20 < windows._4_4_ &&
           (iVar1 = glfwWindowShouldClose((GLFWwindow *)puStack_30[iStack_20]), iVar1 == 0))) {
      iStack_20 = iStack_20 + 1;
    }
    if (iStack_20 < windows._4_4_) break;
    fflush(_stdout);
  }
  glfwTerminate();
  exit(0);
}

Assistant:

int main(int argc, char** argv)
{
    int ch, i, window_count;
    GLboolean auto_iconify = GL_TRUE, fullscreen = GL_FALSE, all_monitors = GL_FALSE;
    GLFWwindow** windows;

    while ((ch = getopt(argc, argv, "afhn")) != -1)
    {
        switch (ch)
        {
            case 'a':
                all_monitors = GL_TRUE;
                break;

            case 'h':
                usage();
                exit(EXIT_SUCCESS);

            case 'f':
                fullscreen = GL_TRUE;
                break;

            case 'n':
                auto_iconify = GL_FALSE;
                break;

            default:
                usage();
                exit(EXIT_FAILURE);
        }
    }

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    glfwWindowHint(GLFW_AUTO_ICONIFY, auto_iconify);

    if (fullscreen && all_monitors)
    {
        int monitor_count;
        GLFWmonitor** monitors = glfwGetMonitors(&monitor_count);

        window_count = monitor_count;
        windows = calloc(window_count, sizeof(GLFWwindow*));

        for (i = 0;  i < monitor_count;  i++)
        {
            windows[i] = create_window(monitors[i]);
            if (!windows[i])
                break;
        }
    }
    else
    {
        GLFWmonitor* monitor = NULL;

        if (fullscreen)
            monitor = glfwGetPrimaryMonitor();

        window_count = 1;
        windows = calloc(window_count, sizeof(GLFWwindow*));
        windows[0] = create_window(monitor);
    }

    for (i = 0;  i < window_count;  i++)
    {
        glfwSetKeyCallback(windows[i], key_callback);
        glfwSetFramebufferSizeCallback(windows[i], framebuffer_size_callback);
        glfwSetWindowSizeCallback(windows[i], window_size_callback);
        glfwSetWindowFocusCallback(windows[i], window_focus_callback);
        glfwSetWindowIconifyCallback(windows[i], window_iconify_callback);
        glfwSetWindowRefreshCallback(windows[i], window_refresh_callback);

        window_refresh_callback(windows[i]);

        printf("Window is %s and %s\n",
            glfwGetWindowAttrib(windows[i], GLFW_ICONIFIED) ? "iconified" : "restored",
            glfwGetWindowAttrib(windows[i], GLFW_FOCUSED) ? "focused" : "defocused");
    }

    for (;;)
    {
        glfwPollEvents();

        for (i = 0;  i < window_count;  i++)
        {
            if (glfwWindowShouldClose(windows[i]))
                break;
        }

        if (i < window_count)
            break;

        // Workaround for an issue with msvcrt and mintty
        fflush(stdout);
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}